

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

bool google::protobuf::compiler::CodeGeneratorRequest::IsInitializedImpl(MessageLite *msg)

{
  bool bVar1;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *pRVar2;
  CodeGeneratorRequest *this_;
  MessageLite *msg_local;
  
  pRVar2 = _internal_proto_file((CodeGeneratorRequest *)msg);
  bVar1 = protobuf::internal::AllAreInitialized<google::protobuf::FileDescriptorProto>(pRVar2);
  if (bVar1) {
    pRVar2 = _internal_source_file_descriptors((CodeGeneratorRequest *)msg);
    bVar1 = protobuf::internal::AllAreInitialized<google::protobuf::FileDescriptorProto>(pRVar2);
    if (bVar1) {
      msg_local._7_1_ = true;
    }
    else {
      msg_local._7_1_ = false;
    }
  }
  else {
    msg_local._7_1_ = false;
  }
  return msg_local._7_1_;
}

Assistant:

PROTOBUF_NOINLINE bool CodeGeneratorRequest::IsInitializedImpl(
    const MessageLite& msg) {
  auto& this_ = static_cast<const CodeGeneratorRequest&>(msg);
  if (!::google::protobuf::internal::AllAreInitialized(this_._internal_proto_file()))
    return false;
  if (!::google::protobuf::internal::AllAreInitialized(this_._internal_source_file_descriptors()))
    return false;
  return true;
}